

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

xmlParserInputPtr xmlNoNetExternalEntityLoader(char *URL,char *ID,xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlParserInputPtr input;
  int oldOptions;
  xmlParserCtxtPtr ctxt_local;
  char *ID_local;
  char *URL_local;
  
  input._4_4_ = 0;
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    input._4_4_ = ctxt->options;
    ctxt->options = ctxt->options | 0x800;
  }
  pxVar1 = xmlDefaultExternalEntityLoader(URL,ID,ctxt);
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->options = input._4_4_;
  }
  return pxVar1;
}

Assistant:

xmlParserInputPtr
xmlNoNetExternalEntityLoader(const char *URL, const char *ID,
                             xmlParserCtxtPtr ctxt) {
    int oldOptions = 0;
    xmlParserInputPtr input;

    if (ctxt != NULL) {
        oldOptions = ctxt->options;
        ctxt->options |= XML_PARSE_NONET;
    }

    input = xmlDefaultExternalEntityLoader(URL, ID, ctxt);

    if (ctxt != NULL)
        ctxt->options = oldOptions;

    return(input);
}